

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

bool Fossilize::parse_bucket_variant_dependencies
               (Value *deps,
               vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
               *variant_deps)

{
  bool bVar1;
  ConstValueIterator pGVar2;
  anon_class_8_1_ba1d7991_for__M_pred __pred;
  VariantDependencyMap *pVVar3;
  VariantDependencyMap *pVVar4;
  VariantDependencyMap *find_itr;
  char *str;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *elem;
  ConstValueIterator itr;
  vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
  *variant_deps_local;
  Value *deps_local;
  
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsArray(deps);
  if (bVar1) {
    std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>::clear
              (variant_deps);
    for (elem = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Begin(deps);
        pGVar2 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::End(deps), elem != pGVar2; elem = elem + 1) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsString(elem);
      if (!bVar1) {
        return false;
      }
      __pred.str = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(elem);
      pVVar3 = std::begin<Fossilize::VariantDependencyMap_const,17ul>
                         ((VariantDependencyMap (*) [17])variant_dependency_map);
      pVVar4 = std::end<Fossilize::VariantDependencyMap_const,17ul>
                         ((VariantDependencyMap (*) [17])variant_dependency_map);
      pVVar3 = std::
               find_if<Fossilize::VariantDependencyMap_const*,Fossilize::parse_bucket_variant_dependencies(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&,std::vector<Fossilize::VariantDependency,std::allocator<Fossilize::VariantDependency>>&)::__0>
                         (pVVar3,pVVar4,__pred);
      pVVar4 = std::end<Fossilize::VariantDependencyMap_const,17ul>
                         ((VariantDependencyMap (*) [17])variant_dependency_map);
      if (pVVar3 == pVVar4) {
        fprintf(_stderr,"Fossilize WARN: Couldn\'t find variant dependency for %s, ignoring.\n",
                __pred.str);
      }
      else {
        std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>::
        push_back(variant_deps,&pVVar3->dep);
      }
    }
    deps_local._7_1_ = true;
  }
  else {
    fprintf(_stderr,"Fossilize ERROR: bucketVariantDependencies must be an array.\n");
    deps_local._7_1_ = false;
  }
  return deps_local._7_1_;
}

Assistant:

static bool parse_bucket_variant_dependencies(const Value &deps, std::vector<VariantDependency> &variant_deps)
{
	if (!deps.IsArray())
	{
		LOGE("bucketVariantDependencies must be an array.\n");
		return false;
	}

	variant_deps.clear();

	for (auto itr = deps.Begin(); itr != deps.End(); ++itr)
	{
		auto &elem = *itr;
		if (!elem.IsString())
			return false;

		const char *str = elem.GetString();

		auto find_itr = std::find_if(std::begin(variant_dependency_map), std::end(variant_dependency_map),
		                             [str](const VariantDependencyMap &m) { return strcmp(str, m.env) == 0; });
		if (find_itr != std::end(variant_dependency_map))
			variant_deps.push_back(find_itr->dep);
		else
			LOGW("Couldn't find variant dependency for %s, ignoring.\n", str);
	}

	return true;
}